

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PidOfIdentiferAt
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,EncodedCharPtr last,
          bool fHadEscape,bool fHasMultiChar)

{
  HashTbl *this_00;
  bool fHasMultiChar_local;
  bool fHadEscape_local;
  EncodedCharPtr last_local;
  EncodedCharPtr p_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  if ((fHasMultiChar) || (fHadEscape)) {
    this_local = (Scanner<UTF8EncodingPolicyBase<false>_> *)PidOfIdentiferAt(this,p,last);
  }
  else {
    this_00 = GetHashTbl(this);
    this_local = (Scanner<UTF8EncodingPolicyBase<false>_> *)
                 HashTbl::PidHashNameLen<char>(this_00,(char *)p,(char *)last,(int)last - (int)p);
  }
  return (IdentPtr)this_local;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::PidOfIdentiferAt(EncodedCharPtr p, EncodedCharPtr last, bool fHadEscape, bool fHasMultiChar)
{
    // If there is an escape sequence in the JS6 identifier or it is a UTF8
    // source then we have to convert it to the equivalent char so we use a
    // buffer for translation.
    if ((EncodingPolicy::MultiUnitEncoding && fHasMultiChar) || fHadEscape)
    {
        return PidOfIdentiferAt(p, last);
    }
    else if (EncodingPolicy::MultiUnitEncoding)
    {
        Assert(sizeof(EncodedChar) == 1);
        return this->GetHashTbl()->PidHashNameLen(reinterpret_cast<const char *>(p), reinterpret_cast<const char *>(last), (int32)(last - p));
    }
    else
    {
        Assert(sizeof(EncodedChar) == 2);
        return this->GetHashTbl()->PidHashNameLen(reinterpret_cast< const char16 * >(p), (int32)(last - p));
    }
}